

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
::Chain_matrix(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
               *this,Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
                     *matrixToCopy,Column_settings *colSettings)

{
  __node_base *p_Var1;
  
  Matrix_all_dimension_holder<int>::Matrix_all_dimension_holder
            (&this->super_Matrix_dimension_option,&matrixToCopy->super_Matrix_dimension_option);
  Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
  ::Chain_pairing(&this->super_Chain_pairing_option,&matrixToCopy->super_Chain_pairing_option);
  Matrix_row_access<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>_>_>,_std::vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>_>_>_>_>,_false,_unsigned_int>
  ::Matrix_row_access(&this->super_Matrix_row_access_option,
                      &matrixToCopy->super_Matrix_row_access_option);
  (this->matrix_)._M_h._M_buckets = &(this->matrix_)._M_h._M_single_bucket;
  (this->matrix_)._M_h._M_bucket_count = 1;
  (this->matrix_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->matrix_)._M_h._M_element_count = 0;
  (this->matrix_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->matrix_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->matrix_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&(this->pivotToColumnIndex_)._M_h,&(matrixToCopy->pivotToColumnIndex_)._M_h);
  this->nextIndex_ = matrixToCopy->nextIndex_;
  if (colSettings == (Column_settings *)0x0) {
    colSettings = matrixToCopy->colSettings_;
  }
  this->colSettings_ = colSettings;
  std::__detail::
  _Rehash_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_std::integral_constant<bool,_true>_>
  ::reserve((_Rehash_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_std::integral_constant<bool,_true>_>
             *)&this->matrix_,(matrixToCopy->matrix_)._M_h._M_element_count);
  p_Var1 = &(matrixToCopy->matrix_)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    _container_insert(this,(Column *)(p_Var1 + 2),(Index)*(size_type *)(p_Var1 + 1));
  }
  return;
}

Assistant:

inline Chain_matrix<Master_matrix>::Chain_matrix(const Chain_matrix& matrixToCopy, Column_settings* colSettings)
    : Dim_opt(static_cast<const Dim_opt&>(matrixToCopy)),
      Pair_opt(static_cast<const Pair_opt&>(matrixToCopy)),
      Swap_opt(static_cast<const Swap_opt&>(matrixToCopy)),
      Rep_opt(static_cast<const Rep_opt&>(matrixToCopy)),
      RA_opt(static_cast<const RA_opt&>(matrixToCopy)),
      pivotToColumnIndex_(matrixToCopy.pivotToColumnIndex_),
      nextIndex_(matrixToCopy.nextIndex_),
      colSettings_(colSettings == nullptr ? matrixToCopy.colSettings_ : colSettings)
{
  matrix_.reserve(matrixToCopy.matrix_.size());
  for (const auto& cont : matrixToCopy.matrix_){
    if constexpr (Master_matrix::Option_list::has_map_column_container){
      _container_insert(cont.second, cont.first);
    } else {
      _container_insert(cont);
    }
  }
}